

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_internal.c
# Opt level: O3

void bench_field_sqrt(void *arg,int iters)

{
  secp256k1_fe *r;
  secp256k1_gej *r_00;
  int iVar1;
  int iVar2;
  int iVar3;
  secp256k1_fe *psVar4;
  int iVar5;
  secp256k1_fe t;
  secp256k1_fe local_58;
  
  if (iters < 1) {
    iVar3 = 0;
    psVar4 = (secp256k1_fe *)arg;
    iVar2 = iters;
  }
  else {
    r = (secp256k1_fe *)((long)arg + 0x40);
    iVar3 = 0;
    iVar5 = iters;
    do {
      local_58.n[4] = *(uint64_t *)((long)arg + 0x60);
      local_58.n[0] = r->n[0];
      local_58.n[1] = *(uint64_t *)((long)arg + 0x48);
      local_58.n[2] = *(uint64_t *)((long)arg + 0x50);
      local_58.n[3] = *(uint64_t *)((long)arg + 0x58);
      psVar4 = r;
      iVar2 = (int)&local_58;
      iVar1 = secp256k1_fe_sqrt(r,&local_58);
      iVar3 = iVar3 + iVar1;
      *(long *)((long)arg + 0x40) = *(long *)((long)arg + 0x68) + *(long *)((long)arg + 0x40);
      *(long *)((long)arg + 0x48) = *(long *)((long)arg + 0x70) + *(long *)((long)arg + 0x48);
      *(long *)((long)arg + 0x50) = *(long *)((long)arg + 0x78) + *(long *)((long)arg + 0x50);
      *(long *)((long)arg + 0x58) = *(long *)((long)arg + 0x80) + *(long *)((long)arg + 0x58);
      *(long *)((long)arg + 0x60) = *(long *)((long)arg + 0x60) + *(long *)((long)arg + 0x88);
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
  }
  if (iters < iVar3) {
    bench_field_sqrt_cold_1();
    if (0 < iVar2) {
      r_00 = (secp256k1_gej *)(psVar4 + 10);
      do {
        if ((int)psVar4[0xd].n[0] == 0) {
          secp256k1_gej_double(r_00,r_00);
        }
        else {
          *(undefined4 *)psVar4[0xd].n = 1;
          psVar4[0xc].n[2] = 0;
          psVar4[0xc].n[3] = 0;
          psVar4[0xc].n[0] = 0;
          psVar4[0xc].n[1] = 0;
          psVar4[0xb].n[3] = 0;
          psVar4[0xb].n[4] = 0;
          psVar4[0xb].n[1] = 0;
          psVar4[0xb].n[2] = 0;
          psVar4[10].n[4] = 0;
          psVar4[0xb].n[0] = 0;
          psVar4[10].n[2] = 0;
          psVar4[10].n[3] = 0;
          (r_00->x).n[0] = 0;
          psVar4[10].n[1] = 0;
          psVar4[0xc].n[4] = 0;
        }
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
    }
    return;
  }
  return;
}

Assistant:

static void bench_field_sqrt(void* arg, int iters) {
    int i, j = 0;
    bench_inv *data = (bench_inv*)arg;
    secp256k1_fe t;

    for (i = 0; i < iters; i++) {
        t = data->fe[0];
        j += secp256k1_fe_sqrt(&data->fe[0], &t);
        secp256k1_fe_add(&data->fe[0], &data->fe[1]);
    }
    CHECK(j <= iters);
}